

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::bt_peer_connection::on_sent
          (bt_peer_connection *this,error_code *error,size_t bytes_transferred)

{
  int iVar1;
  const_iterator __first;
  range *prVar2;
  time_point32 tVar3;
  iterator i;
  const_iterator cVar4;
  int bytes_protocol;
  const_iterator __last;
  int bytes_payload;
  int iVar5;
  int iVar6;
  shared_ptr<libtorrent::aux::torrent> t;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_38;
  __weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  bytes_protocol = (int)bytes_transferred;
  if (error->failed_ == true) {
    peer_connection::sent_bytes(&this->super_peer_connection,0,bytes_protocol);
    return;
  }
  __first._M_current =
       (this->m_payloads).
       super__Vector_base<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>
       ._M_impl.super__Vector_impl_data._M_start;
  prVar2 = (this->m_payloads).
           super__Vector_base<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current == prVar2) {
    bytes_payload = 0;
  }
  else {
    bytes_payload = 0;
    __last._M_current = __first._M_current;
    for (cVar4._M_current = __first._M_current; cVar4._M_current != prVar2;
        cVar4._M_current = cVar4._M_current + 1) {
      iVar5 = (cVar4._M_current)->start - bytes_protocol;
      (cVar4._M_current)->start = iVar5;
      if (iVar5 < 0) {
        iVar1 = (cVar4._M_current)->length;
        iVar6 = iVar1 + iVar5;
        if (iVar6 == 0 || SCARRY4(iVar1,iVar5) != iVar6 < 0) {
          bytes_payload = bytes_payload + iVar1;
          __last._M_current = __last._M_current + 1;
        }
        else {
          bytes_payload = bytes_payload - iVar5;
          (cVar4._M_current)->length = iVar6;
          (cVar4._M_current)->start = 0;
        }
      }
    }
    ::std::
    vector<libtorrent::aux::bt_peer_connection::range,_std::allocator<libtorrent::aux::bt_peer_connection::range>_>
    ::erase(&this->m_payloads,__first,__last);
  }
  peer_connection::sent_bytes
            (&this->super_peer_connection,bytes_payload,bytes_protocol - bytes_payload);
  if (0 < bytes_payload) {
    ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              (&local_28,
               &(this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
    ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,&local_28);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_28._M_refcount);
    if (local_38._M_ptr != (element_type *)0x0) {
      tVar3 = time_now32();
      ((local_38._M_ptr)->m_last_upload).__d.__r = (rep_conflict)tVar3.__d.__r;
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  return;
}

Assistant:

void bt_peer_connection::on_sent(error_code const& error
		, std::size_t const bytes_transferred)
	{
		INVARIANT_CHECK;

		if (error)
		{
			sent_bytes(0, int(bytes_transferred));
			return;
		}

		// manage the payload markers
		int amount_payload = 0;
		if (!m_payloads.empty())
		{
			// this points to the first entry to not erase. i.e.
			// [begin, first_to_keep) will be erased because
			// the payload ranges they represent have been sent
			auto first_to_keep = m_payloads.begin();

			for (auto i = m_payloads.begin(); i != m_payloads.end(); ++i)
			{
				i->start -= int(bytes_transferred);
				if (i->start < 0)
				{
					if (i->start + i->length <= 0)
					{
						amount_payload += i->length;
						TORRENT_ASSERT(first_to_keep == i);
						++first_to_keep;
					}
					else
					{
						amount_payload += -i->start;
						i->length -= -i->start;
						i->start = 0;
					}
				}
			}

			// remove all payload ranges that have been sent
			m_payloads.erase(m_payloads.begin(), first_to_keep);
		}

		TORRENT_ASSERT(amount_payload <= int(bytes_transferred));
		sent_bytes(amount_payload, int(bytes_transferred) - amount_payload);

		if (amount_payload > 0)
		{
			auto t = associated_torrent().lock();
			TORRENT_ASSERT(t);
			if (t) t->update_last_upload();
		}
	}